

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::GetAttachmentParametersTest::Clean
          (GetAttachmentParametersTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  uint local_20;
  uint local_1c;
  GLuint i_1;
  GLuint i;
  Functions *gl;
  GetAttachmentParametersTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->m_fbo != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo);
    this->m_fbo = 0;
  }
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    if (this->m_rbo[local_1c] != 0) {
      (**(code **)(lVar3 + 0x460))(1,this->m_rbo + local_1c);
      this->m_rbo[local_1c] = 0;
    }
  }
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    if (this->m_to[local_20] != 0) {
      (**(code **)(lVar3 + 0x460))(1,this->m_to + local_20);
      this->m_to[local_20] = 0;
    }
  }
  do {
    iVar1 = (**(code **)(lVar3 + 0x800))();
  } while (iVar1 != 0);
  return;
}

Assistant:

void GetAttachmentParametersTest::Clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Releasing obnjects. */
	if (m_fbo)
	{
		gl.deleteFramebuffers(1, &m_fbo);

		m_fbo = 0;
	}

	/* Releasing renderbuffers. */
	for (glw::GLuint i = 0; i < 2; ++i)
	{
		if (m_rbo[i])
		{
			gl.deleteRenderbuffers(1, &m_rbo[i]);

			m_rbo[i] = 0;
		}
	}

	/* Releasing textures. */
	for (glw::GLuint i = 0; i < 2; ++i)
	{
		if (m_to[i])
		{
			gl.deleteRenderbuffers(1, &m_to[i]);

			m_to[i] = 0;
		}
	}

	/* Errors clean up. */
	while (gl.getError())
		;
}